

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_cs.c
# Opt level: O1

cupdlp_dcs * cupdlp_dcs_spfree(cupdlp_dcs *A)

{
  if (A != (cupdlp_dcs *)0x0) {
    if (A->p != (int *)0x0) {
      free(A->p);
    }
    if (A->i != (int *)0x0) {
      free(A->i);
    }
    if (A->x != (double *)0x0) {
      free(A->x);
    }
    free(A);
  }
  return (cupdlp_dcs *)0x0;
}

Assistant:

cupdlp_dcs *cupdlp_dcs_spfree(cupdlp_dcs *A) {
  if (!A) return (NULL); /* do nothing if A already NULL */
  cupdlp_dcs_free(A->p);
  cupdlp_dcs_free(A->i);
  cupdlp_dcs_free(A->x);
  return ((cupdlp_dcs *)cupdlp_dcs_free(
      A)); /* free the cupdlp_dcs struct and return NULL */
}